

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3LocateTable(Parse *pParse,int isView,char *zName,char *zDbase)

{
  int iVar1;
  char *pcVar2;
  char *zMsg;
  Table *p;
  char *zDbase_local;
  char *zName_local;
  int isView_local;
  Parse *pParse_local;
  
  iVar1 = sqlite3ReadSchema(pParse);
  if (iVar1 == 0) {
    pParse_local = (Parse *)sqlite3FindTable(pParse->db,zName,zDbase);
    if (pParse_local == (Parse *)0x0) {
      pcVar2 = "no such table";
      if (isView != 0) {
        pcVar2 = "no such view";
      }
      if (zDbase == (char *)0x0) {
        sqlite3ErrorMsg(pParse,"%s: %s",pcVar2,zName);
      }
      else {
        sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar2,zDbase,zName);
      }
      pParse->checkSchema = '\x01';
    }
  }
  else {
    pParse_local = (Parse *)0x0;
  }
  return (Table *)pParse_local;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTable(
  Parse *pParse,         /* context in which to report errors */
  int isView,            /* True if looking for a VIEW rather than a TABLE */
  const char *zName,     /* Name of the table we are looking for */
  const char *zDbase     /* Name of the database.  Might be NULL */
){
  Table *p;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    return 0;
  }

  p = sqlite3FindTable(pParse->db, zName, zDbase);
  if( p==0 ){
    const char *zMsg = isView ? "no such view" : "no such table";
    if( zDbase ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s", zMsg, zDbase, zName);
    }else{
      sqlite3ErrorMsg(pParse, "%s: %s", zMsg, zName);
    }
    pParse->checkSchema = 1;
  }
  return p;
}